

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O1

bool __thiscall CMU462::Timeline::unmarkTime(Timeline *this,int time)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar4;
  int local_1c;
  
  p_Var1 = &(this->times)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->times)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < time]) {
    if (time <= (int)p_Var3[1]._M_color) {
      p_Var2 = p_Var3;
    }
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) && (p_Var3 = p_Var2, time < (int)p_Var2[1]._M_color)) {
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    local_1c = time;
    pVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            equal_range(&(this->times)._M_t,&local_1c);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
              (&(this->times)._M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
  }
  return (_Rb_tree_header *)p_Var3 != p_Var1;
}

Assistant:

bool Timeline::unmarkTime(int time) {
  if (times.find(time) != times.end()) {
    times.erase(time);
    return true;
  }

  return false;
}